

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyObject * pybind11::detail::make_new_instance(PyTypeObject *type)

{
  instance *this;
  instance *inst;
  PyObject *self;
  PyTypeObject *type_local;
  
  this = (instance *)(*type->tp_alloc)(type,0);
  instance::allocate_layout(this);
  return &this->ob_base;
}

Assistant:

inline PyObject *make_new_instance(PyTypeObject *type) {
#if defined(PYPY_VERSION)
    // PyPy gets tp_basicsize wrong (issue 2482) under multiple inheritance when the first
    // inherited object is a plain Python type (i.e. not derived from an extension type).  Fix it.
    ssize_t instance_size = static_cast<ssize_t>(sizeof(instance));
    if (type->tp_basicsize < instance_size) {
        type->tp_basicsize = instance_size;
    }
#endif
    PyObject *self = type->tp_alloc(type, 0);
    auto *inst = reinterpret_cast<instance *>(self);
    // Allocate the value/holder internals:
    inst->allocate_layout();

    return self;
}